

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

int trie_node_clear(trie t,trie_node n)

{
  long lVar1;
  int iVar2;
  vector v;
  size_t sVar3;
  long *plVar4;
  set_iterator it_00;
  set_value __ptr;
  undefined8 *puVar5;
  long in_RSI;
  long in_RDI;
  trie_node current_node;
  trie_node_ref ref_node;
  set_iterator it;
  trie_node_free_conflict free_node;
  trie_node back;
  trie_node *back_ptr;
  vector node_stack;
  set in_stack_ffffffffffffffa8;
  set in_stack_ffffffffffffffb0;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = 1;
  }
  else {
    v = vector_create(0x11d9a0);
    vector_push_back((vector)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    while (sVar3 = vector_size(v), sVar3 != 0) {
      plVar4 = (long *)vector_back((vector)in_stack_ffffffffffffffa8);
      vector_pop_back((vector)0x11d9e1);
      if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
        lVar1 = *plVar4;
        if (*(long *)(lVar1 + 0x20) != 0) {
          it_00 = set_iterator_begin(in_stack_ffffffffffffffa8);
          while (iVar2 = set_iterator_end((set_iterator *)in_stack_ffffffffffffffa8), 0 < iVar2) {
            __ptr = set_iterator_get_value(it_00);
            in_stack_ffffffffffffffb0 =
                 (set)(*(long *)(in_RDI + 8) + *(long *)((long)__ptr + 8) * 0x28);
            vector_push_back((vector)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            free(__ptr);
            set_iterator_next(it_00);
          }
          set_destroy(in_stack_ffffffffffffffb0);
        }
        puVar5 = (undefined8 *)malloc(0x10);
        if (puVar5 == (undefined8 *)0x0) {
          log_write_impl_va("metacall",0x278,"trie_node_clear",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,LOG_LEVEL_ERROR,"Trie invalid free node allocation");
          vector_destroy((vector)0x11dae3);
          return 1;
        }
        *puVar5 = *(undefined8 *)(in_RDI + 0x20);
        puVar5[1] = *(undefined8 *)(lVar1 + 8);
        *(undefined8 **)(in_RDI + 0x20) = puVar5;
        *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
      }
    }
    vector_destroy((vector)0x11db3e);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int trie_node_clear(trie t, trie_node n)
{
	if (t != NULL && n != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &n);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				trie_node_free free_node;

				if (back->childs != NULL)
				{
					set_iterator it;

					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);

						free(ref_node);
					}

					set_destroy(back->childs);
				}

				free_node = malloc(sizeof(struct trie_node_free_type));

				if (free_node == NULL)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid free node allocation");

					vector_destroy(node_stack);

					return 1;
				}

				free_node->next = t->free_node_list;

				free_node->index = back->self_index;

				t->free_node_list = free_node;

				--t->size;
			}
		}

		vector_destroy(node_stack);

		return 0;
	}

	return 1;
}